

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswPairs.c
# Opt level: O0

Aig_Man_t * Ssw_SignalCorrespondeceTestPairs(Aig_Man_t *pAig)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  abctime aVar6;
  Aig_Man_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pObj_01;
  Aig_Obj_t *pAVar7;
  abctime aVar8;
  abctime clk;
  int i;
  int RetValue;
  Aig_Obj_t *pRepr;
  Aig_Obj_t *pObj;
  Vec_Int_t *vIds2;
  Vec_Int_t *vIds1;
  Ssw_Pars_t *pPars;
  Ssw_Pars_t Pars;
  Aig_Man_t *pAigRes;
  Aig_Man_t *pAigNew;
  Aig_Man_t *pAig_local;
  
  aVar6 = Abc_Clock();
  Ssw_ManSetDefaultParams((Ssw_Pars_t *)&pPars);
  Pars.fScorrGia = 1;
  p = Ssw_SignalCorrespondence(pAig,(Ssw_Pars_t *)&pPars);
  iVar1 = Aig_ManObjNumMax(pAig);
  p_00 = Vec_IntAlloc(iVar1);
  iVar1 = Aig_ManObjNumMax(pAig);
  p_01 = Vec_IntAlloc(iVar1);
  for (clk._0_4_ = 0; iVar1 = Vec_PtrSize(pAig->vObjs), (int)clk < iVar1; clk._0_4_ = (int)clk + 1)
  {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,(int)clk);
    if (((pObj_00 != (Aig_Obj_t *)0x0) &&
        (pObj_01 = Aig_Regular((Aig_Obj_t *)(pObj_00->field_5).pData), pObj_01 != (Aig_Obj_t *)0x0))
       && (pAVar7 = Aig_ManObj(p,pObj_01->Id), pAVar7 != (Aig_Obj_t *)0x0)) {
      iVar1 = Aig_ObjId(pObj_00);
      Vec_IntPush(p_00,iVar1);
      iVar1 = Aig_ObjId(pObj_01);
      Vec_IntPush(p_01,iVar1);
    }
  }
  uVar2 = Vec_IntSize(p_00);
  uVar3 = Aig_ManObjNumMax(pAig);
  uVar4 = Aig_ManObjNumMax(p);
  Abc_Print(1,"Recorded %d pairs (before: %d  after: %d).\n",(ulong)uVar2,(ulong)uVar3,(ulong)uVar4)
  ;
  Pars.pFunc = Ssw_SignalCorrespondenceWithPairs(pAig,p,p_00,p_01,(Ssw_Pars_t *)&pPars);
  Vec_IntFree(p_00);
  Vec_IntFree(p_01);
  iVar1 = Ssw_MiterStatus((Aig_Man_t *)Pars.pFunc,1);
  if (iVar1 == 1) {
    Abc_Print(1,"Verification successful.  ");
  }
  else if (iVar1 == 0) {
    Abc_Print(1,"Verification failed with the counter-example.  ");
  }
  else {
    uVar2 = Aig_ManRegNum((Aig_Man_t *)Pars.pFunc);
    iVar1 = Aig_ManRegNum(pAig);
    iVar5 = Aig_ManRegNum(p);
    Abc_Print(1,"Verification UNDECIDED. Remaining registers %d (total %d).  ",(ulong)uVar2,
              (ulong)(uint)(iVar1 + iVar5));
  }
  Abc_Print(1,"%s =","Time");
  aVar8 = Abc_Clock();
  Abc_Print(1,"%9.2f sec\n",((double)(aVar8 - aVar6) * 1.0) / 1000000.0);
  Aig_ManStop(p);
  return (Aig_Man_t *)Pars.pFunc;
}

Assistant:

Aig_Man_t * Ssw_SignalCorrespondeceTestPairs( Aig_Man_t * pAig )
{
    Aig_Man_t * pAigNew, * pAigRes;
    Ssw_Pars_t Pars, * pPars = &Pars;
    Vec_Int_t * vIds1, * vIds2;
    Aig_Obj_t * pObj, * pRepr;
    int RetValue, i;
    abctime clk = Abc_Clock();
    Ssw_ManSetDefaultParams( pPars );
    pPars->fVerbose = 1;
    pAigNew = Ssw_SignalCorrespondence( pAig, pPars );
    // record pairs of equivalent nodes
    vIds1 = Vec_IntAlloc( Aig_ManObjNumMax(pAig) );
    vIds2 = Vec_IntAlloc( Aig_ManObjNumMax(pAig) );
    Aig_ManForEachObj( pAig, pObj, i )
    {
        pRepr = Aig_Regular((Aig_Obj_t *)pObj->pData);
        if ( pRepr == NULL )
            continue;
        if ( Aig_ManObj(pAigNew, pRepr->Id) == NULL )
            continue;
/*
        if ( Aig_ObjIsNode(pObj) )
            Abc_Print( 1, "n " );
        else if ( Saig_ObjIsPi(pAig, pObj) )
            Abc_Print( 1, "pi " );
        else if ( Saig_ObjIsLo(pAig, pObj) )
            Abc_Print( 1, "lo " );
*/
        Vec_IntPush( vIds1, Aig_ObjId(pObj) );
        Vec_IntPush( vIds2, Aig_ObjId(pRepr) );
    }
    Abc_Print( 1, "Recorded %d pairs (before: %d  after: %d).\n", Vec_IntSize(vIds1), Aig_ManObjNumMax(pAig), Aig_ManObjNumMax(pAigNew) );
    // try the new AIGs
    pAigRes = Ssw_SignalCorrespondenceWithPairs( pAig, pAigNew, vIds1, vIds2, pPars );
    Vec_IntFree( vIds1 );
    Vec_IntFree( vIds2 );
    // report the results
    RetValue = Ssw_MiterStatus( pAigRes, 1 );
    if ( RetValue == 1 )
        Abc_Print( 1, "Verification successful.  " );
    else if ( RetValue == 0 )
        Abc_Print( 1, "Verification failed with the counter-example.  " );
    else
        Abc_Print( 1, "Verification UNDECIDED. Remaining registers %d (total %d).  ",
            Aig_ManRegNum(pAigRes), Aig_ManRegNum(pAig) + Aig_ManRegNum(pAigNew) );
    ABC_PRT( "Time", Abc_Clock() - clk );
    // cleanup
    Aig_ManStop( pAigNew );
    return pAigRes;
}